

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O0

_Bool borg_destroy_floor(void)

{
  loc_conflict grid;
  object *poVar1;
  borg_take *pbVar2;
  char *what;
  borg_take *take;
  
  if (borg_grids[borg.c.y][borg.c.x].take == '\0') {
    take._7_1_ = false;
  }
  else {
    grid.y = borg.c.y;
    grid.x = borg.c.x;
    poVar1 = borg_get_top_object((chunk *)cave,grid);
    if (poVar1 == (object *)0x0) {
      take._7_1_ = false;
    }
    else {
      pbVar2 = borg_takes + borg_grids[borg.c.y][borg.c.x].take;
      if (pbVar2->value == L'\xfffffff6') {
        if ((pbVar2->kind == (object_kind *)0x0) || (pbVar2->kind->base == (object_base *)0x0)) {
          borg_note("# Destroying floor item.");
        }
        else {
          what = format("# Destroying floor item %s%s",pbVar2->kind->base->name,pbVar2->kind->name);
          borg_note(what);
        }
        borg_keypress(0x6b);
        borg_keypress(0x2d);
        borg_keypress(0x61);
        borg_keypress(0x61);
        take._7_1_ = true;
      }
      else {
        take._7_1_ = false;
      }
    }
  }
  return take._7_1_;
}

Assistant:

bool borg_destroy_floor(void)
{
    if (!borg_grids[borg.c.y][borg.c.x].take)
        return false;

    /* double check that there is an object here.  This is simulating doing */
    /* "look" so it is okay */
    if (!borg_get_top_object(cave, borg.c))
        return false;

    borg_take *take = &borg_takes[borg_grids[borg.c.y][borg.c.x].take];
    if (take->value != -10)
        return false;

    if (take->kind && take->kind->base)
        borg_note(format("# Destroying floor item %s%s", take->kind->base->name, take->kind->name));
    else
        borg_note("# Destroying floor item.");

    /* ignore it now */
    borg_keypress('k');
    borg_keypress('-');
    borg_keypress('a');
    borg_keypress('a');
    return true;
}